

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O3

void __thiscall asmjit::VMemMgr::~VMemMgr(VMemMgr *this)

{
  PermanentNode *pPVar1;
  PermanentNode *__ptr;
  
  vMemMgrReset(this,this->_keepVirtualMemory);
  __ptr = this->_permanent;
  while (__ptr != (PermanentNode *)0x0) {
    pPVar1 = __ptr->prev;
    free(__ptr);
    __ptr = pPVar1;
  }
  pthread_mutex_destroy((pthread_mutex_t *)this);
  return;
}

Assistant:

VMemMgr::~VMemMgr() noexcept {
  // Freeable memory cleanup - Also frees the virtual memory if configured to.
  vMemMgrReset(this, _keepVirtualMemory);

  // Permanent memory cleanup - Never frees the virtual memory.
  PermanentNode* node = _permanent;
  while (node) {
    PermanentNode* prev = node->prev;
    Internal::releaseMemory(node);
    node = prev;
  }
}